

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffpkym(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  size_t sVar1;
  size_t sVar2;
  char local_138 [8];
  char card [81];
  char local_d8 [8];
  char tmpstring [71];
  char local_88 [8];
  char valstring [71];
  int *status_local;
  char *comm_local;
  int decim_local;
  double *value_local;
  char *keyname_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    unique0x100001e3 = status;
    strcpy(local_88,"(");
    ffd2e(*value,decim,local_d8,stack0xffffffffffffffc0);
    sVar1 = strlen(local_88);
    sVar2 = strlen(local_d8);
    if (sVar1 + sVar2 + 2 < 0x47) {
      strcat(local_88,local_d8);
      strcat(local_88,", ");
      ffd2e(value[1],decim,local_d8,stack0xffffffffffffffc0);
      sVar1 = strlen(local_88);
      sVar2 = strlen(local_d8);
      if (sVar1 + sVar2 + 1 < 0x47) {
        strcat(local_88,local_d8);
        strcat(local_88,")");
        ffmkky(keyname,local_88,comm,local_138,stack0xffffffffffffffc0);
        ffprec(fptr,local_138,stack0xffffffffffffffc0);
        fptr_local._4_4_ = *stack0xffffffffffffffc0;
      }
      else {
        ffpmsg("Error converting complex to string (ffpkym)");
        *stack0xffffffffffffffc0 = 0x192;
        fptr_local._4_4_ = 0x192;
      }
    }
    else {
      ffpmsg("Error converting complex to string (ffpkym)");
      *stack0xffffffffffffffc0 = 0x192;
      fptr_local._4_4_ = 0x192;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffpkym( fitsfile *fptr,      /* I - FITS file pointer                   */
            const char  *keyname,/* I - name of keyword to write            */
            double *value,       /* I - keyword value (real, imaginary)     */
            int   decim,         /* I - number of decimal places to display */
            const char  *comm,   /* I - keyword comment                     */
            int   *status)       /* IO - error status                       */
/*
  Write (put) the keyword, value and comment into the FITS header.
  Writes an complex double keyword value. Format = (realvalue, imagvalue)
*/
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    strcpy(valstring, "(" );
    ffd2e(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+2 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2e(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring)+strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("Error converting complex to string (ffpkym)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    ffmkky(keyname, valstring, comm, card, status);  /* construct the keyword*/
    ffprec(fptr, card, status);  /* write the keyword*/

    return(*status);
}